

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::DeadBranchElimPass::EraseDeadBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *unreachable_merges,
          unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
          *unreachable_continues)

{
  BasicBlock *pBVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  IRContext *pIVar4;
  mapped_type pBVar5;
  pointer puVar6;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar7;
  bool bVar8;
  array<signed_char,_4UL> aVar9;
  _Type acVar10;
  size_type sVar11;
  __node_base_ptr p_Var12;
  mapped_type *ppBVar13;
  size_type sVar14;
  __node_base_ptr p_Var15;
  uint32_t index;
  iterator __position;
  Op local_f4;
  _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_f0;
  Instruction *local_e8;
  Instruction *local_e0;
  IRContext *local_d8;
  int local_d0 [2];
  undefined1 local_c8 [40];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a0;
  Function *local_90;
  initializer_list<spvtools::opt::Operand> local_88;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_58;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *local_50;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_48;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_40;
  MemPass *local_38;
  
  __position._M_current =
       (func->blocks_).
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  bVar8 = false;
  if (__position._M_current !=
      (func->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_50 = &func->blocks_;
    bVar8 = false;
    local_f0 = &unreachable_continues->_M_h;
    local_90 = func;
    local_48 = &live_blocks->_M_h;
    local_40 = &unreachable_merges->_M_h;
    local_38 = &this->super_MemPass;
    do {
      local_c8._0_8_ =
           ((__position._M_current)->_M_t).
           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      sVar11 = std::
               _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(&unreachable_continues->_M_h,(key_type *)local_c8);
      if (sVar11 == 0) {
        local_c8._0_8_ =
             ((__position._M_current)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        sVar14 = std::
                 _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(local_40,(key_type *)local_c8);
        unreachable_continues =
             (unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
              *)local_f0;
        if (sVar14 == 0) {
          local_c8._0_8_ =
               ((__position._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          sVar14 = std::
                   _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(local_48,(key_type *)local_c8);
          if (sVar14 == 0) {
            MemPass::KillAllInsts
                      (&this->super_MemPass,
                       ((__position._M_current)->_M_t).
                       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,true)
            ;
            pvVar7 = local_50;
            puVar6 = (local_50->
                     super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::_M_erase(local_50,__position);
            __position._M_current =
                 (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  *)((long)__position._M_current +
                    ((long)(pvVar7->
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start - (long)puVar6));
            bVar8 = true;
            func = local_90;
            unreachable_continues =
                 (unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
                  *)local_f0;
          }
          else {
            __position._M_current = __position._M_current + 1;
            unreachable_continues =
                 (unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
                  *)local_f0;
          }
        }
        else {
          pBVar1 = ((__position._M_current)->_M_t).
                   super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          pIVar2 = *(Instruction **)
                    ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
          ;
          if ((pIVar2 == (Instruction *)0x0) ||
             ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
          goto LAB_001ed9f8;
          pIVar3 = *(Instruction **)
                    ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18)
          ;
          if ((pIVar2 != pIVar3) || (pIVar3->opcode_ != OpUnreachable)) {
            MemPass::KillAllInsts(&this->super_MemPass,pBVar1,false);
            pBVar1 = ((__position._M_current)->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                     .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
            local_78._0_8_ = (this->super_MemPass).super_Pass.context_;
            local_88._M_array = (iterator)CONCAT44(local_88._M_array._4_4_,0xff);
            local_d8 = (IRContext *)((ulong)local_d8 & 0xffffffff00000000);
            local_f4 = OpNop;
            local_c8._0_8_ = (BasicBlock *)0x0;
            local_c8._8_8_ = (undefined **)0x0;
            MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                      ((spvtools *)&local_e8,(IRContext **)local_78,(Op *)&local_88,(int *)&local_d8
                       ,(int *)&local_f4,(initializer_list<spvtools::opt::Operand> *)local_c8);
            pIVar2 = local_e8;
            local_e8 = (Instruction *)0x0;
            utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                      (&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar2);
            if (local_e8 != (Instruction *)0x0) {
              (**(code **)(*(long *)local_e8 + 8))();
            }
            local_e8 = (Instruction *)0x0;
            pBVar1 = ((__position._M_current)->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                     .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
            pIVar2 = *(Instruction **)
                      ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> +
                      0x10);
            if ((pIVar2 == (Instruction *)0x0) ||
               ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)
               ) goto LAB_001ed9f8;
            IRContext::AnalyzeUses
                      ((this->super_MemPass).super_Pass.context_,
                       *(Instruction **)
                        ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> +
                        0x18));
            pBVar5 = ((__position._M_current)->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                     .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
            pIVar2 = *(Instruction **)
                      ((long)&(pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                              sentinel_ + 8);
            if ((pIVar2 == (Instruction *)0x0) ||
               ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)
               ) goto LAB_001ed9f8;
            pIVar4 = (this->super_MemPass).super_Pass.context_;
            local_c8._0_8_ =
                 *(Instruction **)
                  ((long)&(pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
                  + 0x10);
            if ((pIVar4->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
              ppBVar13 = std::__detail::
                         _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&pIVar4->instr_to_block_,(key_type *)local_c8);
              *ppBVar13 = pBVar5;
            }
            bVar8 = true;
          }
          __position._M_current = __position._M_current + 1;
        }
      }
      else {
        pBVar1 = ((__position._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        p_Var12 = (unreachable_continues->_M_h)._M_buckets
                  [(ulong)pBVar1 % (unreachable_continues->_M_h)._M_bucket_count];
        for (p_Var15 = (unreachable_continues->_M_h)._M_buckets
                       [(ulong)pBVar1 % (unreachable_continues->_M_h)._M_bucket_count]->_M_nxt;
            pBVar1 != (BasicBlock *)p_Var15[1]._M_nxt; p_Var15 = p_Var15->_M_nxt) {
          p_Var12 = p_Var15;
        }
        pIVar2 = (Instruction *)p_Var12->_M_nxt[2]._M_nxt[1]._M_nxt;
        aVar9._M_elems[0] = '\0';
        aVar9._M_elems[1] = '\0';
        aVar9._M_elems[2] = '\0';
        aVar9._M_elems[3] = '\0';
        if (pIVar2->has_result_id_ == true) {
          aVar9._M_elems =
               (_Type)Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
        }
        pBVar1 = ((__position._M_current)->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        pIVar2 = *(Instruction **)
                  ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
        if ((pIVar2 == (Instruction *)0x0) ||
           ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
        goto LAB_001ed9f8;
        pIVar3 = *(Instruction **)
                  ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18);
        if ((pIVar2 == pIVar3) && (pIVar3->opcode_ == OpBranch)) {
          index = (pIVar3->has_result_id_ & 1) + 1;
          if (pIVar3->has_type_id_ == false) {
            index = (uint)pIVar3->has_result_id_;
          }
          acVar10 = (_Type)Instruction::GetSingleWordOperand(pIVar3,index);
          if (acVar10 != aVar9._M_elems) goto LAB_001ed622;
        }
        else {
LAB_001ed622:
          MemPass::KillAllInsts
                    (&this->super_MemPass,
                     ((__position._M_current)->_M_t).
                     super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                     .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,false);
          local_c8._0_8_ =
               ((__position._M_current)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          sVar11 = std::
                   _Hashtable<spvtools::opt::BasicBlock_*,_std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::count(local_f0,(key_type *)local_c8);
          if (sVar11 == 0) {
            __assert_fail("unreachable_continues.count(&*ebi)",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/dead_branch_elim_pass.cpp"
                          ,0x17e,
                          "bool spvtools::opt::DeadBranchElimPass::EraseDeadBlocks(Function *, const std::unordered_set<BasicBlock *> &, const std::unordered_set<BasicBlock *> &, const std::unordered_map<BasicBlock *, BasicBlock *> &)"
                         );
          }
          pBVar1 = ((__position._M_current)->_M_t).
                   super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          local_d8 = (this->super_MemPass).super_Pass.context_;
          local_f4 = OpBranch;
          local_d0[1] = 0;
          local_d0[0] = 0;
          local_78._0_8_ = &PTR__SmallVector_003e9b28;
          local_78._24_8_ = local_78 + 0x10;
          local_58._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_78._8_8_ = 1;
          local_c8._0_4_ = 1;
          local_c8._8_8_ = &PTR__SmallVector_003e9b28;
          local_c8._16_8_ = 0;
          local_c8._32_8_ = local_c8 + 0x18;
          local_a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_78._16_4_ = aVar9._M_elems;
          utils::SmallVector<unsigned_int,_2UL>::operator=
                    ((SmallVector<unsigned_int,_2UL> *)(local_c8 + 8),
                     (SmallVector<unsigned_int,_2UL> *)local_78);
          local_88._M_len = 1;
          local_88._M_array = (iterator)local_c8;
          MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                    ((spvtools *)&local_e0,&local_d8,&local_f4,local_d0 + 1,local_d0,&local_88);
          pIVar2 = local_e0;
          local_e0 = (Instruction *)0x0;
          utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                    (&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar2);
          if (local_e0 != (Instruction *)0x0) {
            (**(code **)(*(long *)local_e0 + 8))();
          }
          local_e0 = (Instruction *)0x0;
          local_c8._8_8_ = &PTR__SmallVector_003e9b28;
          if (local_a0 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_a0,local_a0);
          }
          this = (DeadBranchElimPass *)local_38;
          local_a0 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_78._0_8_ = &PTR__SmallVector_003e9b28;
          if (local_58._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_58,local_58._M_head_impl);
          }
          pIVar4 = (this->super_MemPass).super_Pass.context_;
          if ((pIVar4->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(pIVar4);
          }
          pBVar1 = ((__position._M_current)->_M_t).
                   super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          pIVar2 = *(Instruction **)
                    ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
          ;
          if ((pIVar2 == (Instruction *)0x0) ||
             ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
          {
LAB_001ed9f8:
            __assert_fail("!insts_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                          ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
          }
          analysis::DefUseManager::AnalyzeInstUse
                    ((pIVar4->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl,
                     *(Instruction **)
                      ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> +
                      0x18));
          pBVar5 = ((__position._M_current)->_M_t).
                   super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                   .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
          pIVar2 = *(Instruction **)
                    ((long)&(pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                            sentinel_ + 8);
          if ((pIVar2 == (Instruction *)0x0) ||
             ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
          goto LAB_001ed9f8;
          pIVar4 = (this->super_MemPass).super_Pass.context_;
          local_c8._0_8_ =
               *(Instruction **)
                ((long)&(pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_ +
                0x10);
          if ((pIVar4->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
            ppBVar13 = std::__detail::
                       _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&pIVar4->instr_to_block_,(key_type *)local_c8);
            *ppBVar13 = pBVar5;
          }
          bVar8 = true;
        }
        __position._M_current = __position._M_current + 1;
        func = local_90;
        unreachable_continues =
             (unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
              *)local_f0;
      }
    } while (__position._M_current !=
             (func->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return bVar8;
}

Assistant:

bool DeadBranchElimPass::EraseDeadBlocks(
    Function* func, const std::unordered_set<BasicBlock*>& live_blocks,
    const std::unordered_set<BasicBlock*>& unreachable_merges,
    const std::unordered_map<BasicBlock*, BasicBlock*>& unreachable_continues) {
  bool modified = false;
  for (auto ebi = func->begin(); ebi != func->end();) {
    if (unreachable_continues.count(&*ebi)) {
      uint32_t cont_id = unreachable_continues.find(&*ebi)->second->id();
      if (ebi->begin() != ebi->tail() ||
          ebi->terminator()->opcode() != spv::Op::OpBranch ||
          ebi->terminator()->GetSingleWordInOperand(0u) != cont_id) {
        // Make unreachable, but leave the label.
        KillAllInsts(&*ebi, false);
        // Add unconditional branch to header.
        assert(unreachable_continues.count(&*ebi));
        ebi->AddInstruction(MakeUnique<Instruction>(
            context(), spv::Op::OpBranch, 0, 0,
            std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {cont_id}}}));
        get_def_use_mgr()->AnalyzeInstUse(&*ebi->tail());
        context()->set_instr_block(&*ebi->tail(), &*ebi);
        modified = true;
      }
      ++ebi;
    } else if (unreachable_merges.count(&*ebi)) {
      if (ebi->begin() != ebi->tail() ||
          ebi->terminator()->opcode() != spv::Op::OpUnreachable) {
        // Make unreachable, but leave the label.
        KillAllInsts(&*ebi, false);
        // Add unreachable terminator.
        ebi->AddInstruction(
            MakeUnique<Instruction>(context(), spv::Op::OpUnreachable, 0, 0,
                                    std::initializer_list<Operand>{}));
        context()->AnalyzeUses(ebi->terminator());
        context()->set_instr_block(ebi->terminator(), &*ebi);
        modified = true;
      }
      ++ebi;
    } else if (!live_blocks.count(&*ebi)) {
      // Kill this block.
      KillAllInsts(&*ebi);
      ebi = ebi.Erase();
      modified = true;
    } else {
      ++ebi;
    }
  }

  return modified;
}